

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O3

void __thiscall cppcms::plugin::scope::load(scope *this,string *name)

{
  _data *p_Var1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  char cVar5;
  iterator iVar6;
  locale *loc;
  shared_object *this_00;
  pointer pbVar7;
  long *plVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  mapped_type *pmVar11;
  size_type *psVar12;
  long lVar13;
  _Alloc_hider _Var14;
  ulong uVar15;
  shared_ptr<booster::shared_object> obj;
  string so_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  unique_lock<std::mutex> guard;
  string path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  string_type local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  formattible_type local_200;
  undefined1 local_1f0 [24];
  unique_lock<std::mutex> local_1d8;
  string_type local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  char local_178 [16];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158 [2];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138 [2];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118 [20];
  pointer local_78;
  
  class_data();
  local_1d8._M_device = &class_data::d.lock;
  local_1d8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1d8);
  local_1d8._M_owns = true;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&class_data::d.modules._M_t,name);
  if ((_Rb_tree_header *)iVar6._M_node != &class_data::d.modules._M_t._M_impl.super__Rb_tree_header)
  goto LAB_00226604;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  p_Var1 = (this->d).ptr_;
  sVar2 = (p_Var1->pattern)._M_string_length;
  if (sVar2 == 0) {
    booster::shared_object::name((string *)local_1a8);
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_1a8);
    _Var14._M_p = (pointer)local_1a8._0_8_;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_002262c8;
  }
  else {
    pcVar3 = (p_Var1->pattern)._M_dataplus._M_p;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,pcVar3,pcVar3 + sVar2);
    booster::locale::basic_format<char>::basic_format((basic_format<char> *)local_1a8,&local_1c8);
    local_200.writer_ = booster::locale::details::formattible<char>::write<std::__cxx11::string>;
    local_200.pointer_ = name;
    booster::locale::basic_format<char>::add((basic_format<char> *)local_1a8,&local_200);
    loc = (locale *)std::locale::classic();
    booster::locale::basic_format<char>::str_abi_cxx11_
              (&local_240,(basic_format<char> *)local_1a8,loc);
    std::__cxx11::string::operator=((string *)&local_220,(string *)&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_128._M_p != local_118) {
      operator_delete(local_128._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_168._M_p != local_158) {
      operator_delete(local_168._M_p);
    }
    if (local_188._M_p != local_1a8 + 0x30) {
      operator_delete(local_188._M_p);
    }
    _Var14._M_p = local_1c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_002262c8:
      operator_delete(_Var14._M_p);
    }
  }
  this_00 = (shared_object *)operator_new(8);
  booster::shared_object::shared_object(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::shared_object*>
            (&local_248,this_00);
  p_Var1 = (this->d).ptr_;
  pbVar7 = (p_Var1->paths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 == (p_Var1->paths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    cVar5 = booster::shared_object::open((string *)this_00,(int)&local_220);
    if (cVar5 == '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Failed to load ",&local_220);
      booster::runtime_error::runtime_error(prVar10,(string *)local_1a8);
      *(undefined ***)prVar10 = &PTR__runtime_error_00284840;
      (prVar10->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(prVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  else {
    lVar13 = 8;
    uVar15 = 0;
    local_1f0._16_8_ = name;
    do {
      lVar4 = *(long *)((long)pbVar7 + lVar13 + -8);
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,lVar4,
                 *(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar13) + lVar4);
      if ((char_type *)local_1a8._8_8_ == (char_type *)0x0) {
        std::__cxx11::string::_M_assign((string *)local_1a8);
      }
      else {
        local_200.pointer_ = local_1f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,local_1a8._0_8_,
                   (char_type *)(local_1a8._8_8_ + local_1a8._0_8_));
        std::__cxx11::string::append((char *)&local_200);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_240.field_2._M_allocated_capacity = *psVar12;
          local_240.field_2._8_8_ = plVar8[3];
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar12;
          local_240._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_240._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if ((string *)local_200.pointer_ != (string *)local_1f0) {
          operator_delete(local_200.pointer_);
        }
      }
      cVar5 = booster::shared_object::open((string *)this_00,(int)(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if (cVar5 != '\0') break;
      uVar15 = uVar15 + 1;
      p_Var1 = (this->d).ptr_;
      pbVar7 = (p_Var1->paths).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar15 < (ulong)((long)(p_Var1->paths).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))
    ;
    cVar5 = booster::shared_object::is_open();
    name = (string *)local_1f0._16_8_;
    if (cVar5 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Failed to load ",0xf)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," from ",6);
      p_Var1 = (this->d).ptr_;
      if ((p_Var1->paths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (p_Var1->paths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 8;
        uVar15 = 0;
        do {
          if (uVar15 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"`",1);
          pbVar7 = (((this->d).ptr_)->paths).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar7 + lVar13 + -8),
                              *(long *)((long)&pbVar7->_M_dataplus + lVar13));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
          p_Var1 = (this->d).ptr_;
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar15 < (ulong)((long)(p_Var1->paths).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(p_Var1->paths).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      booster::runtime_error::runtime_error(prVar10,&local_240);
      *(undefined ***)prVar10 = &PTR__runtime_error_00284840;
      (prVar10->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(prVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
            ::operator[](&((this->d).ptr_)->objects,name);
  (pmVar11->super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = this_00
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar11->super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&local_248);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&class_data::d.modules,name);
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
LAB_00226604:
  std::unique_lock<std::mutex>::~unique_lock(&local_1d8);
  return;
}

Assistant:

void scope::load(std::string const &name)
{
	_class_data &cls = class_data();
	booster::unique_lock<booster::mutex> guard(cls.lock);
	if(cls.modules.find(name)!=cls.modules.end())
		return;
	std::string so_name;
	if(d->pattern.empty())
		so_name = booster::shared_object::name(name);
	else
		so_name = (booster::locale::format(d->pattern) % name).str(std::locale::classic());

	booster::shared_ptr<booster::shared_object> obj(new booster::shared_object());
	int dlflags = booster::shared_object::load_lazy |  booster::shared_object::load_global;
	if(d->paths.empty()) {
		if(!obj->open(so_name,dlflags)) 
			throw cppcms_error("Failed to load " + so_name);
	}
	else {
		for(size_t i=0;i<d->paths.size();i++) {
			std::string path  = d->paths[i];
			if(path.empty())
				path = so_name;
			else
				path = path + "/" + so_name;
			if(obj->open(path,dlflags))
				break;
		}
		if(!obj->is_open()) {
			std::ostringstream ss;
			ss << "Failed to load " << so_name << " from ";
			for(size_t i=0;i<d->paths.size();i++) {
				if(i!=0) {
					ss << ", ";
				}
				ss << "`" << d->paths[i] << "'";
			}
			throw cppcms_error(ss.str());
		}
	}
	d->objects[name]=obj;
	cls.modules.insert(name);
}